

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrSceneComponentsLocateInfoMSFT *value)

{
  NextChainResult NVar1;
  ValidateXrHandleResult VVar2;
  XrResult XVar3;
  XrSpace_T *in_stack_fffffffffffffd48;
  string local_2a8;
  string local_288;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  string error_message;
  
  XVar3 = XR_SUCCESS;
  if (value->type != XR_TYPE_SCENE_COMPONENTS_LOCATE_INFO_MSFT) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrSceneComponentsLocateInfoMSFT",value->type
               ,"VUID-XrSceneComponentsLocateInfoMSFT-type-type",
               XR_TYPE_SCENE_COMPONENTS_LOCATE_INFO_MSFT,"XR_TYPE_SCENE_COMPONENTS_LOCATE_INFO_MSFT"
              );
  }
  if (!check_pnext) goto LAB_0016ca81;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar1 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_2a8);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_2a8,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::string
              ((string *)&local_2a8,"VUID-XrSceneComponentsLocateInfoMSFT-next-unique",
               (allocator *)&stack0xfffffffffffffd4e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1f8,objects_info);
    std::__cxx11::string::string
              ((string *)&local_288,
               "Multiple structures of the same type(s) in \"next\" chain for XrSceneComponentsLocateInfoMSFT struct"
               ,(allocator *)&stack0xfffffffffffffd4f);
    CoreValidLogMessage(instance_info,&local_2a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1f8,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1f8);
    std::__cxx11::string::~string((string *)&local_2a8);
LAB_0016ca4f:
    std::__cxx11::string::~string((string *)&error_message);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrSceneComponentsLocateInfoMSFT-next-next",
               (allocator *)&local_288);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1e0,objects_info);
    std::__cxx11::string::string
              ((string *)&local_2a8,
               "Invalid structure(s) in \"next\" chain for XrSceneComponentsLocateInfoMSFT struct \"next\""
               ,(allocator *)&stack0xfffffffffffffd4e);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1e0,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1e0);
    goto LAB_0016ca4f;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_0016ca81:
  if (check_members && XVar3 == XR_SUCCESS) {
    VVar2 = VerifyXrSpaceHandle(&value->baseSpace);
    if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
      XVar3 = XR_SUCCESS;
      if ((value->componentIdCount != 0) && (value->componentIds == (XrUuidMSFT *)0x0)) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "VUID-XrSceneComponentsLocateInfoMSFT-componentIds-parameter",
                   (allocator *)&local_288);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_228,objects_info);
        std::__cxx11::string::string
                  ((string *)&local_2a8,
                   "Structure XrSceneComponentsLocateInfoMSFT member componentIdCount is NULL, but value->componentIdCount is greater than 0"
                   ,(allocator *)&valid_ext_structs);
        CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_228,&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_228);
        std::__cxx11::string::~string((string *)&error_message);
        XVar3 = XR_ERROR_VALIDATION_FAILURE;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,"Invalid XrSpace handle \"baseSpace\" ");
      HandleToHexString<XrSpace_T*>(in_stack_fffffffffffffd48);
      std::operator<<((ostream *)&error_message,(string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::string
                ((string *)&local_2a8,"VUID-XrSceneComponentsLocateInfoMSFT-baseSpace-parameter",
                 (allocator *)&valid_ext_structs);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_210,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_2a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_210,&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_210);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
      XVar3 = XR_ERROR_HANDLE_INVALID;
    }
  }
  return XVar3;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSceneComponentsLocateInfoMSFT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SCENE_COMPONENTS_LOCATE_INFO_MSFT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrSceneComponentsLocateInfoMSFT",
                             value->type, "VUID-XrSceneComponentsLocateInfoMSFT-type-type", XR_TYPE_SCENE_COMPONENTS_LOCATE_INFO_MSFT, "XR_TYPE_SCENE_COMPONENTS_LOCATE_INFO_MSFT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrSceneComponentsLocateInfoMSFT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrSceneComponentsLocateInfoMSFT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrSceneComponentsLocateInfoMSFT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrSceneComponentsLocateInfoMSFT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrSceneComponentsLocateInfoMSFT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    {
        // writeValidateInlineHandleValidation
        ValidateXrHandleResult handle_result = VerifyXrSpaceHandle(&value->baseSpace);
        if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
            // Not a valid handle or NULL (which is not valid in this case)
            std::ostringstream oss;
            oss << "Invalid XrSpace handle \"baseSpace\" ";
            oss << HandleToHexString(value->baseSpace);
            CoreValidLogMessage(instance_info, "VUID-XrSceneComponentsLocateInfoMSFT-baseSpace-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, oss.str());
            return XR_ERROR_HANDLE_INVALID;
        }
    }
    // Optional array must be non-NULL when value->componentIdCount is non-zero
    if (0 != value->componentIdCount && nullptr == value->componentIds) {
        CoreValidLogMessage(instance_info, "VUID-XrSceneComponentsLocateInfoMSFT-componentIds-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrSceneComponentsLocateInfoMSFT member componentIdCount is NULL, but value->componentIdCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrSceneComponentsLocateInfoMSFT-componentIds-parameter" type
    // Everything checked out properly
    return xr_result;
}